

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O1

yajl_val yajl_tree_get(yajl_val n,char **path,yajl_type type)

{
  char *__s1;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  if (path != (char **)0x0) {
    do {
      if ((n == (yajl_val)0x0) || (__s1 = *path, __s1 == (char *)0x0)) {
        if (type == yajl_t_any) {
          return n;
        }
        if (n == (yajl_val)0x0) {
          return (yajl_val)0x0;
        }
        if (n->type == type) {
          return n;
        }
        return (yajl_val)0x0;
      }
      if (n->type == yajl_t_object) {
        pcVar1 = (n->u).number.r;
        if (pcVar1 == (char *)0x0) {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar2 = (n->u).string;
          pcVar4 = (char *)0x0;
          do {
            iVar3 = strcmp(__s1,*(char **)(pcVar2 + (long)pcVar4 * 8));
            if (iVar3 == 0) {
              n = (n->u).object.values[(long)pcVar4];
              pcVar5 = pcVar4;
              break;
            }
            pcVar4 = pcVar4 + 1;
            pcVar5 = pcVar1;
          } while (pcVar1 != pcVar4);
        }
        bVar6 = pcVar5 != pcVar1;
        path = path + bVar6;
      }
      else {
        bVar6 = false;
      }
    } while (bVar6);
  }
  return (yajl_val)0x0;
}

Assistant:

yajl_val yajl_tree_get(yajl_val n, const char ** path, yajl_type type)
{
    if (!path) return NULL;
    while (n && *path) {
        size_t i;
        size_t len;

        if (n->type != yajl_t_object) return NULL;
        len = n->u.object.len;
        for (i = 0; i < len; i++) {
            if (!strcmp(*path, n->u.object.keys[i])) {
                n = n->u.object.values[i];
                break;
            }
        }
        if (i == len) return NULL;
        path++;
    }
    if (n && type != yajl_t_any && type != n->type) n = NULL;
    return n;
}